

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

ssize_t fio_write2_fn(intptr_t uuid,fio_write_args_s options)

{
  undefined1 *puVar1;
  short *psVar2;
  char cVar3;
  undefined1 uVar4;
  long *plVar5;
  fio_data_s *pfVar6;
  long *ptr;
  code *pcVar7;
  int *piVar8;
  code *pcVar9;
  long *plVar10;
  undefined8 *puVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  fio_lock_i ret;
  timespec local_48;
  long local_38;
  
  if ((-1 < uuid) && (uVar12 = (uint)((ulong)uuid >> 8), uVar12 < fio_data->capa)) {
    lVar14 = (long)(int)uVar12 * 0xa8;
    if (*(char *)((long)fio_data + lVar14 + 0x6d) == (char)uuid) {
      ptr = (long *)fio_malloc(0x30);
      if (ptr == (long *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:278"
                        );
        }
        kill(0,2);
        piVar8 = __errno_location();
        exit(*piVar8);
      }
      *ptr = 0;
      ptr[1] = 0;
      ptr[2] = 0;
      *(anon_union_8_2_d0c08f9f_for_data *)(ptr + 3) = options.data;
      ptr[4] = options.offset;
      ptr[5] = options.length;
      if (((undefined1  [40])options & (undefined1  [40])0x2) == (undefined1  [40])0x0) {
        pcVar9 = free;
        pcVar7 = fio_sock_write_buffer;
      }
      else {
        pcVar7 = fio_sock_write_from_fd;
        if (*(fio_rw_hook_s **)((long)fio_data + lVar14 + 0xa8) == &FIO_DEFAULT_RW_HOOKS) {
          pcVar7 = fio_sock_sendfile_from_fd;
        }
        pcVar9 = fio_sock_perform_close_fd;
      }
      if (options.after.dealloc != (_func_void_void_ptr *)0x0) {
        pcVar9 = (code *)options.after;
      }
      ptr[1] = (long)pcVar7;
      ((anon_union_8_2_2f6647fd_for_after *)(ptr + 2))->dealloc = pcVar9;
      pfVar6 = fio_data;
      LOCK();
      pcVar13 = (char *)((long)fio_data + lVar14 + 0x6e);
      cVar3 = *pcVar13;
      *pcVar13 = '\x01';
      UNLOCK();
      local_38 = lVar14;
      if (cVar3 != '\0') {
        pcVar13 = (char *)((long)pfVar6 + lVar14 + 0x6e);
        do {
          local_48.tv_sec = 0;
          local_48.tv_nsec = 1;
          nanosleep(&local_48,(timespec *)0x0);
          LOCK();
          cVar3 = *pcVar13;
          *pcVar13 = '\x01';
          UNLOCK();
        } while (cVar3 != '\0');
      }
      pfVar6 = fio_data;
      if ((uVar12 < fio_data->capa) &&
         (*(char *)((long)&fio_data[1].thread_ids.obj + local_38 + 5) == (char)uuid)) {
        plVar10 = (long *)((long)&fio_data[1].last_cycle.tv_sec + local_38);
        plVar5 = (long *)*plVar10;
        if (((undefined1  [40])options & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
          puVar11 = (undefined8 *)((long)&fio_data[1].last_cycle.tv_nsec + local_38);
          *(long **)*puVar11 = ptr;
        }
        else {
          if (plVar5 != (long *)0x0) {
            plVar10 = plVar5;
          }
          *ptr = *plVar10;
          *plVar10 = (long)ptr;
          if (*ptr != 0) goto LAB_0010887b;
          puVar11 = (undefined8 *)((long)&pfVar6[1].last_cycle.tv_nsec + local_38);
        }
        *puVar11 = ptr;
LAB_0010887b:
        LOCK();
        psVar2 = (short *)((long)&pfVar6[1].thread_ids.obj + local_38);
        *psVar2 = *psVar2 + 1;
        UNLOCK();
        LOCK();
        puVar1 = (undefined1 *)((long)&fio_data[1].thread_ids.obj + local_38 + 6);
        uVar4 = *puVar1;
        *puVar1 = 0;
        UNLOCK();
        local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar4);
        if (plVar5 != (long *)0x0) {
          return 0;
        }
        *(__time_t *)((long)&fio_data[1].thread_ids.next + local_38) = (fio_data->last_cycle).tv_sec
        ;
        deferred_on_ready((void *)uuid,&DAT_00000001);
        return 0;
      }
      LOCK();
      puVar1 = (undefined1 *)((long)&fio_data[1].thread_ids.obj + local_38 + 6);
      uVar4 = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar4);
      (*(code *)ptr[2])(ptr[3]);
      fio_free(ptr);
      goto LAB_00108749;
    }
  }
  if (options.after.dealloc != (_func_void_void_ptr *)0x0) {
    (*options.after.dealloc)(options.data.buffer);
  }
LAB_00108749:
  piVar8 = __errno_location();
  *piVar8 = 9;
  return -1;
}

Assistant:

ssize_t fio_write2_fn(intptr_t uuid, fio_write_args_s options) {
  if (!uuid_is_valid(uuid))
    goto error;

  /* create packet */
  fio_packet_s *packet = fio_packet_alloc();
  *packet = (fio_packet_s){
      .length = options.length,
      .offset = options.offset,
      .data.buffer = (void *)options.data.buffer,
  };
  if (options.is_fd) {
    packet->write_func = (uuid_data(uuid).rw_hooks == &FIO_DEFAULT_RW_HOOKS)
                             ? fio_sock_sendfile_from_fd
                             : fio_sock_write_from_fd;
    packet->dealloc =
        (options.after.dealloc ? options.after.dealloc
                               : (void (*)(void *))fio_sock_perform_close_fd);
  } else {
    packet->write_func = fio_sock_write_buffer;
    packet->dealloc = (options.after.dealloc ? options.after.dealloc : free);
  }
  /* add packet to outgoing list */
  uint8_t was_empty = 1;
  fio_lock(&uuid_data(uuid).sock_lock);
  if (!uuid_is_valid(uuid)) {
    goto locked_error;
  }
  if (uuid_data(uuid).packet)
    was_empty = 0;
  if (options.urgent == 0) {
    *uuid_data(uuid).packet_last = packet;
    uuid_data(uuid).packet_last = &packet->next;
  } else {
    fio_packet_s **pos = &uuid_data(uuid).packet;
    if (*pos)
      pos = &(*pos)->next;
    packet->next = *pos;
    *pos = packet;
    if (!packet->next) {
      uuid_data(uuid).packet_last = &packet->next;
    }
  }
  fio_atomic_add(&uuid_data(uuid).packet_count, 1);
  fio_unlock(&uuid_data(uuid).sock_lock);

  if (was_empty) {
    touchfd(fio_uuid2fd(uuid));
    deferred_on_ready((void *)uuid, (void *)1);
  }
  return 0;
locked_error:
  fio_unlock(&uuid_data(uuid).sock_lock);
  fio_packet_free(packet);
  errno = EBADF;
  return -1;
error:
  if (options.after.dealloc) {
    options.after.dealloc((void *)options.data.buffer);
  }
  errno = EBADF;
  return -1;
}